

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall embree::SceneGraph::GroupNode::remove_mblur(GroupNode *this,bool mblur)

{
  ulong uVar1;
  size_type sVar2;
  byte in_SIL;
  long in_RDI;
  size_t i;
  undefined1 in_stack_00000337;
  Ref<embree::SceneGraph::Node> *in_stack_00000338;
  Node *local_50;
  long *local_48;
  ulong local_40;
  byte local_31;
  long **local_28;
  Node **local_20;
  reference local_10;
  Node **local_8;
  
  local_31 = in_SIL & 1;
  local_40 = 0;
  while( true ) {
    uVar1 = local_40;
    sVar2 = std::
            vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
            ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    *)(in_RDI + 0x68));
    if (sVar2 <= uVar1) break;
    local_10 = std::
               vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                             *)(in_RDI + 0x68),local_40);
    local_8 = &local_50;
    local_50 = local_10->ptr;
    if (local_50 != (Node *)0x0) {
      (*(local_50->super_RefCount)._vptr_RefCount[2])();
    }
    SceneGraph::remove_mblur(in_stack_00000338,(bool)in_stack_00000337);
    local_28 = &local_48;
    if (local_48 != (long *)0x0) {
      (**(code **)(*local_48 + 0x18))();
    }
    local_20 = &local_50;
    if (local_50 != (Node *)0x0) {
      (*(local_50->super_RefCount)._vptr_RefCount[3])();
    }
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

void remove_mblur(bool mblur)
      {
        for (size_t i=0; i<children.size(); i++)
          SceneGraph::remove_mblur(children[i], mblur);
      }